

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O0

UBool __thiscall
icu_63::MessagePattern::copyStorage
          (MessagePattern *this,MessagePattern *other,UErrorCode *errorCode)

{
  UBool UVar1;
  MessagePatternPartsList *this_00;
  Part *pPVar2;
  MessagePatternDoubleList *this_01;
  double *pdVar3;
  MessagePattern *other_00;
  MessagePatternDoubleList *local_78;
  MessagePatternPartsList *local_68;
  UErrorCode *errorCode_local;
  MessagePattern *other_local;
  MessagePattern *this_local;
  
  other_00 = other;
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    this->parts = (Part *)0x0;
    this->partsLength = 0;
    this->numericValues = (double *)0x0;
    this->numericValuesLength = 0;
    if (this->partsList == (MessagePatternPartsList *)0x0) {
      this_00 = (MessagePatternPartsList *)UMemory::operator_new((UMemory *)0x210,(size_t)other_00);
      local_68 = (MessagePatternPartsList *)0x0;
      if (this_00 != (MessagePatternPartsList *)0x0) {
        other_00 = (MessagePattern *)0x0;
        memset(this_00,0,0x210);
        MessagePatternPartsList::MessagePatternPartsList(this_00);
        local_68 = this_00;
      }
      this->partsList = local_68;
      if (this->partsList == (MessagePatternPartsList *)0x0) {
        *errorCode = U_MEMORY_ALLOCATION_ERROR;
        return '\0';
      }
      pPVar2 = MaybeStackArray<icu_63::MessagePattern::Part,_32>::getAlias
                         ((MaybeStackArray<icu_63::MessagePattern::Part,_32> *)this->partsList);
      this->parts = pPVar2;
    }
    if (0 < other->partsLength) {
      other_00 = (MessagePattern *)other->partsList;
      MessagePatternList<icu_63::MessagePattern::Part,_32>::copyFrom
                (&this->partsList->super_MessagePatternList<icu_63::MessagePattern::Part,_32>,
                 (MessagePatternList<icu_63::MessagePattern::Part,_32> *)other_00,other->partsLength
                 ,errorCode);
      UVar1 = ::U_FAILURE(*errorCode);
      if (UVar1 != '\0') {
        return '\0';
      }
      pPVar2 = MaybeStackArray<icu_63::MessagePattern::Part,_32>::getAlias
                         ((MaybeStackArray<icu_63::MessagePattern::Part,_32> *)this->partsList);
      this->parts = pPVar2;
      this->partsLength = other->partsLength;
    }
    if (0 < other->numericValuesLength) {
      if (this->numericValuesList == (MessagePatternDoubleList *)0x0) {
        this_01 = (MessagePatternDoubleList *)
                  UMemory::operator_new((UMemory *)0x50,(size_t)other_00);
        local_78 = (MessagePatternDoubleList *)0x0;
        if (this_01 != (MessagePatternDoubleList *)0x0) {
          (this_01->super_MessagePatternList<double,_8>).a.stackArray[6] = 0.0;
          (this_01->super_MessagePatternList<double,_8>).a.stackArray[7] = 0.0;
          (this_01->super_MessagePatternList<double,_8>).a.stackArray[4] = 0.0;
          (this_01->super_MessagePatternList<double,_8>).a.stackArray[5] = 0.0;
          (this_01->super_MessagePatternList<double,_8>).a.stackArray[2] = 0.0;
          (this_01->super_MessagePatternList<double,_8>).a.stackArray[3] = 0.0;
          (this_01->super_MessagePatternList<double,_8>).a.stackArray[0] = 0.0;
          (this_01->super_MessagePatternList<double,_8>).a.stackArray[1] = 0.0;
          (this_01->super_MessagePatternList<double,_8>).a.ptr = (double *)0x0;
          (this_01->super_MessagePatternList<double,_8>).a.capacity = 0;
          (this_01->super_MessagePatternList<double,_8>).a.needToRelease = '\0';
          *(undefined3 *)&(this_01->super_MessagePatternList<double,_8>).a.field_0xd = 0;
          MessagePatternDoubleList::MessagePatternDoubleList(this_01);
          local_78 = this_01;
        }
        this->numericValuesList = local_78;
        if (this->numericValuesList == (MessagePatternDoubleList *)0x0) {
          *errorCode = U_MEMORY_ALLOCATION_ERROR;
          return '\0';
        }
        pdVar3 = MaybeStackArray<double,_8>::getAlias
                           ((MaybeStackArray<double,_8> *)this->numericValuesList);
        this->numericValues = pdVar3;
      }
      MessagePatternList<double,_8>::copyFrom
                (&this->numericValuesList->super_MessagePatternList<double,_8>,
                 &other->numericValuesList->super_MessagePatternList<double,_8>,
                 other->numericValuesLength,errorCode);
      UVar1 = ::U_FAILURE(*errorCode);
      if (UVar1 != '\0') {
        return '\0';
      }
      pdVar3 = MaybeStackArray<double,_8>::getAlias
                         ((MaybeStackArray<double,_8> *)this->numericValuesList);
      this->numericValues = pdVar3;
      this->numericValuesLength = other->numericValuesLength;
    }
    this_local._7_1_ = '\x01';
  }
  else {
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UBool
MessagePattern::copyStorage(const MessagePattern &other, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        return FALSE;
    }
    parts=NULL;
    partsLength=0;
    numericValues=NULL;
    numericValuesLength=0;
    if(partsList==NULL) {
        partsList=new MessagePatternPartsList();
        if(partsList==NULL) {
            errorCode=U_MEMORY_ALLOCATION_ERROR;
            return FALSE;
        }
        parts=partsList->a.getAlias();
    }
    if(other.partsLength>0) {
        partsList->copyFrom(*other.partsList, other.partsLength, errorCode);
        if(U_FAILURE(errorCode)) {
            return FALSE;
        }
        parts=partsList->a.getAlias();
        partsLength=other.partsLength;
    }
    if(other.numericValuesLength>0) {
        if(numericValuesList==NULL) {
            numericValuesList=new MessagePatternDoubleList();
            if(numericValuesList==NULL) {
                errorCode=U_MEMORY_ALLOCATION_ERROR;
                return FALSE;
            }
            numericValues=numericValuesList->a.getAlias();
        }
        numericValuesList->copyFrom(
            *other.numericValuesList, other.numericValuesLength, errorCode);
        if(U_FAILURE(errorCode)) {
            return FALSE;
        }
        numericValues=numericValuesList->a.getAlias();
        numericValuesLength=other.numericValuesLength;
    }
    return TRUE;
}